

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O1

void Rand_state_init(uint32_t seed)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 1;
  STATE[0] = seed;
  do {
    seed = seed * 0x41c64e6d + 0x3039;
    STATE[lVar2] = seed;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  iVar1 = 0x140;
  uVar3 = (ulong)state_i;
  do {
    state_i = (int)uVar3 + 1U & 0x1f;
    STATE[state_i] = STATE[state_i] + STATE[uVar3];
    iVar1 = iVar1 + -1;
    uVar3 = (ulong)state_i;
  } while (iVar1 != 0);
  return;
}

Assistant:

void Rand_state_init(uint32_t seed)
{
	int i, j;

	/* Seed the table */
	STATE[0] = seed;

	/* Propagate the seed */
	for (i = 1; i < RAND_DEG; i++)
		STATE[i] = LCRNG(STATE[i - 1]);

	/* Cycle the table ten times per degree */
	for (i = 0; i < RAND_DEG * 10; i++) {
		/* Acquire the next index */
		j = (state_i + 1) % RAND_DEG;

		/* Update the table, extract an entry */
		STATE[j] += STATE[state_i];

		/* Advance the index */
		state_i = j;
	}
}